

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.h
# Opt level: O1

bool __thiscall Js::SimpleTypeHandler<1UL>::SupportsPrototypeInstances(SimpleTypeHandler<1UL> *this)

{
  byte bVar1;
  
  if (DAT_015d6346 == '\0') {
    if (((this->super_DynamicTypeHandler).flags & 0x18) == 0) {
      bVar1 = 1;
    }
    else {
      bVar1 = DAT_015d6345 ^ 1;
    }
  }
  else {
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

virtual bool SupportsPrototypeInstances() const { return !ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()); }